

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O0

void __thiscall MIDISong2::ProcessInitialMetaEvents(MIDISong2 *this)

{
  BYTE BVar1;
  DWORD DVar2;
  TrackInfo *this_00;
  bool bVar3;
  DWORD len;
  BYTE event;
  int i;
  TrackInfo *track;
  MIDISong2 *this_local;
  
  for (len = 0; (int)len < this->NumTracks; len = len + 1) {
    this_00 = this->Tracks + (int)len;
    while( true ) {
      bVar3 = false;
      if ((((this_00->Finished & 1U) == 0) &&
          (bVar3 = false, this_00->TrackP < this_00->MaxTrackP - 4)) &&
         (bVar3 = false, this_00->TrackBegin[this_00->TrackP] == '\0')) {
        bVar3 = this_00->TrackBegin[this_00->TrackP + 1] == 0xff;
      }
      if (!bVar3) break;
      BVar1 = this_00->TrackBegin[this_00->TrackP + 2];
      this_00->TrackP = this_00->TrackP + 3;
      DVar2 = TrackInfo::ReadVarLen(this_00);
      if (this_00->TrackP + (ulong)DVar2 <= this_00->MaxTrackP) {
        if (BVar1 == '/') {
          this_00->Finished = true;
        }
        else if (BVar1 == 'Q') {
          MIDIStreamer::SetTempo
                    (&this->super_MIDIStreamer,
                     (uint)this_00->TrackBegin[this_00->TrackP] << 0x10 |
                     (uint)this_00->TrackBegin[this_00->TrackP + 1] << 8 |
                     (uint)this_00->TrackBegin[this_00->TrackP + 2]);
        }
      }
      this_00->TrackP = (ulong)DVar2 + this_00->TrackP;
    }
    if (this_00->MaxTrackP - 4 <= this_00->TrackP) {
      this_00->Finished = true;
    }
  }
  return;
}

Assistant:

void MIDISong2::ProcessInitialMetaEvents ()
{
	TrackInfo *track;
	int i;
	BYTE event;
	DWORD len;

	for (i = 0; i < NumTracks; ++i)
	{
		track = &Tracks[i];
		while (!track->Finished &&
				track->TrackP < track->MaxTrackP - 4 &&
				track->TrackBegin[track->TrackP] == 0 &&
				track->TrackBegin[track->TrackP+1] == 0xFF)
		{
			event = track->TrackBegin[track->TrackP+2];
			track->TrackP += 3;
			len = track->ReadVarLen ();
			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					SetTempo(
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2])
					);
					break;
				}
			}
			track->TrackP += len;
		}
		if (track->TrackP >= track->MaxTrackP - 4)
		{
			track->Finished = true;
		}
	}
}